

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  FileDescriptor *pFVar4;
  string *psVar5;
  undefined1 local_178 [8];
  string module_name_1;
  undefined1 local_150 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string import_statement;
  int last_dot_pos;
  undefined1 local_60 [8];
  string module_alias;
  string module_name;
  string *filename;
  int i;
  Generator *this_local;
  
  filename._4_4_ = 0;
  while( true ) {
    iVar3 = FileDescriptor::dependency_count(this->file_);
    if (iVar3 <= filename._4_4_) break;
    pFVar4 = FileDescriptor::dependency(this->file_,filename._4_4_);
    psVar5 = FileDescriptor::name_abi_cxx11_(pFVar4);
    anon_unknown_0::ModuleName((string *)((long)&module_alias.field_2 + 8),psVar5);
    anon_unknown_0::ModuleAlias((string *)local_60,psVar5);
    bVar2 = anon_unknown_0::ContainsPythonKeyword((string *)((long)&module_alias.field_2 + 8));
    if (bVar2) {
      io::Printer::Print(this->printer_,"import importlib\n");
      io::Printer::Print(this->printer_,"$alias$ = importlib.import_module(\'$name$\')\n","alias",
                         (string *)local_60,"name",(string *)((long)&module_alias.field_2 + 8));
    }
    else {
      import_statement.field_2._8_4_ =
           std::__cxx11::string::rfind((char)&module_alias + '\x18',0x2e);
      std::__cxx11::string::string((string *)local_90);
      if (import_statement.field_2._8_4_ == -1) {
        std::operator+(&local_b0,"import ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&module_alias.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_130,(ulong)((long)&module_alias.field_2 + 8));
        std::operator+(&local_110,"from ",&local_130);
        std::operator+(&local_f0,&local_110," import ");
        std::__cxx11::string::substr((ulong)local_150,(ulong)((long)&module_alias.field_2 + 8));
        std::operator+(&local_d0,&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_150);
        std::__cxx11::string::operator=((string *)local_90,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)local_150);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
      }
      io::Printer::Print(this->printer_,"$statement$ as $alias$\n","statement",(string *)local_90,
                         "alias",(string *)local_60);
      std::__cxx11::string::~string((string *)local_90);
    }
    pFVar4 = FileDescriptor::dependency(this->file_,filename._4_4_);
    CopyPublicDependenciesAliases(this,(string *)local_60,pFVar4);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(module_alias.field_2._M_local_buf + 8));
    filename._4_4_ = filename._4_4_ + 1;
  }
  io::Printer::Print(this->printer_,"\n");
  module_name_1.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = module_name_1.field_2._12_4_;
    iVar3 = FileDescriptor::public_dependency_count(this->file_);
    if (iVar3 <= (int)uVar1) break;
    pFVar4 = FileDescriptor::public_dependency(this->file_,module_name_1.field_2._12_4_);
    psVar5 = FileDescriptor::name_abi_cxx11_(pFVar4);
    anon_unknown_0::ModuleName((string *)local_178,psVar5);
    io::Printer::Print(this->printer_,"from $module$ import *\n","module",(string *)local_178);
    std::__cxx11::string::~string((string *)local_178);
    module_name_1.field_2._12_4_ = module_name_1.field_2._12_4_ + 1;
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const string& filename = file_->dependency(i)->name();

    string module_name = ModuleName(filename);
    string module_alias = ModuleAlias(filename);
    if (ContainsPythonKeyword(module_name)) {
      // If the module path contains a Python keyword, we have to quote the
      // module name and import it using importlib. Otherwise the usual kind of
      // import statement would result in a syntax error from the presence of
      // the keyword.
      printer_->Print("import importlib\n");
      printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                      module_alias, "name", module_name);
    } else {
      int last_dot_pos = module_name.rfind('.');
      string import_statement;
      if (last_dot_pos == string::npos) {
        // NOTE(petya): this is not tested as it would require a protocol buffer
        // outside of any package, and I don't think that is easily achievable.
        import_statement = "import " + module_name;
      } else {
        import_statement = "from " + module_name.substr(0, last_dot_pos) +
                           " import " + module_name.substr(last_dot_pos + 1);
      }
      printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                      "alias", module_alias);
    }

    CopyPublicDependenciesAliases(module_alias, file_->dependency(i));
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}